

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.h
# Opt level: O2

size_t __thiscall
Fixpp::
StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'A'>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
::checksum(StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_1024UL>
           *this)

{
  char *pcVar1;
  byte bVar2;
  
  bVar2 = 0;
  for (pcVar1 = (char *)(*(long *)&(this->super_SmallStreamBuf<1024UL,_char>).field_0x20 +
                        this->off_);
      pcVar1 != *(char **)&(this->super_SmallStreamBuf<1024UL,_char>).field_0x28;
      pcVar1 = pcVar1 + 1) {
    bVar2 = bVar2 + *pcVar1;
  }
  return (ulong)bVar2;
}

Assistant:

size_t checksum() const
        {
            const char* p = Base::pbase() + off_;
            const char* end = Base::pptr();

            size_t sum = 0;

            while (p != end)
            {
                sum += static_cast<size_t>(*p);
                ++p;
            }

            return sum % 256;
        }